

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::iterate(DrawCallBatchingTest *this)

{
  ostringstream *poVar1;
  int *piVar2;
  ostringstream *poVar3;
  TestLog *pTVar4;
  TestContext *this_00;
  MessageBuilder *pMVar5;
  ulong uVar6;
  pointer puVar7;
  pointer puVar8;
  int iVar9;
  int precision;
  pointer puVar10;
  IterateResult IVar11;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  pointer puVar15;
  ulong uVar16;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  allocator<char> local_28a;
  allocator<char> local_289;
  TestLog *local_288;
  double local_280;
  double local_278;
  double local_270;
  ScopedLogSection section_1;
  Statistics unbatchedStats;
  ScopedLogSection section;
  double local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  string local_1d0;
  MessageBuilder local_1b0;
  
  IVar11 = CONTINUE;
  switch(this->m_state) {
  case STATE_LOG_INFO:
    pTVar4 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Test info",(allocator<char> *)&local_1f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&unbatchedStats,"Test info",(allocator<char> *)&local_210);
    tcu::ScopedLogSection::ScopedLogSection
              (&section,pTVar4,(string *)&local_1b0,(string *)&unbatchedStats);
    std::__cxx11::string::~string((string *)&unbatchedStats);
    std::__cxx11::string::~string((string *)&local_1b0);
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Rendering using ");
    pcVar13 = "glDrawArrays()";
    if ((this->m_spec).useDrawElements != false) {
      pcVar13 = "glDrawElements()";
    }
    std::operator<<((ostream *)poVar1,pcVar13);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    if ((this->m_spec).useDrawElements == true) {
      poVar1 = &local_1b0.m_str;
      local_1b0.m_log = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Using ");
      pcVar13 = "";
      if ((this->m_spec).dynamicIndices != false) {
        pcVar13 = "dynamic ";
      }
      std::operator<<((ostream *)poVar1,pcVar13);
      std::operator<<((ostream *)poVar1,"indices from ");
      pcVar13 = "pointer";
      if ((this->m_spec).useIndexBuffer != false) {
        pcVar13 = "buffer";
      }
      std::operator<<((ostream *)poVar1,pcVar13);
      std::operator<<((ostream *)poVar1,".");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
    if (0 < (this->m_spec).staticAttributeCount) {
      poVar3 = &local_1b0.m_str;
      local_1b0.m_log = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
      std::operator<<((ostream *)poVar3,"Using ");
      piVar2 = &(this->m_spec).staticAttributeCount;
      pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,piVar2);
      poVar1 = &pMVar5->m_str;
      std::operator<<((ostream *)poVar1," static attribute");
      pcVar13 = "";
      if (1 < *piVar2) {
        pcVar13 = "s";
      }
      std::operator<<((ostream *)poVar1,pcVar13);
      std::operator<<((ostream *)poVar1," from ");
      pcVar13 = "pointer";
      if ((this->m_spec).useStaticBuffer != false) {
        pcVar13 = "buffer";
      }
      std::operator<<((ostream *)poVar1,pcVar13);
      std::operator<<((ostream *)poVar1,".");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
    }
    if (0 < (this->m_spec).dynamicAttributeCount) {
      poVar3 = &local_1b0.m_str;
      local_1b0.m_log = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
      std::operator<<((ostream *)poVar3,"Using ");
      piVar2 = &(this->m_spec).dynamicAttributeCount;
      pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,piVar2);
      poVar1 = &pMVar5->m_str;
      std::operator<<((ostream *)poVar1," dynamic attribute");
      pcVar13 = "";
      if (1 < *piVar2) {
        pcVar13 = "s";
      }
      std::operator<<((ostream *)poVar1,pcVar13);
      std::operator<<((ostream *)poVar1," from ");
      pcVar13 = "pointer";
      if ((this->m_spec).useDynamicBuffer != false) {
        pcVar13 = "buffer";
      }
      std::operator<<((ostream *)poVar1,pcVar13);
      std::operator<<((ostream *)poVar1,".");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
    }
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Rendering ");
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,&(this->m_spec).drawCallCount);
    std::operator<<((ostream *)&pMVar5->m_str," draw calls with ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&(this->m_spec).triangleCount);
    std::operator<<((ostream *)&pMVar5->m_str," triangles per call.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    this->m_state = STATE_WARMUP_BATCHED;
    IVar11 = CONTINUE;
    break;
  case STATE_WARMUP_BATCHED:
    renderBatched(this);
    this->m_state = STATE_WARMUP_UNBATCHED;
    break;
  case STATE_WARMUP_UNBATCHED:
    renderUnbatched(this);
    this->m_state = STATE_SAMPLE;
    break;
  case STATE_CALC_CALIBRATION:
    pTVar4 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    piVar2 = &this->m_sampleIteration;
    de::toString<int>((string *)&section,piVar2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &unbatchedStats,"Sampling iteration ",(string *)&section);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,(char *)unbatchedStats.mean,&local_289);
    de::toString<int>(&local_1d0,piVar2);
    std::operator+(&local_210,"Sampling iteration ",&local_1d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,local_210._M_dataplus._M_p,&local_28a);
    tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar4,(string *)&local_1b0,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&unbatchedStats);
    std::__cxx11::string::~string((string *)&section);
    calculateStats(&unbatchedStats,&this->m_unbatchedSamplesUs);
    calculateStats((Statistics *)&section,&this->m_batchedSamplesUs);
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Batched samples; Count: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,", Mean: ");
    local_288 = section.m_log;
    std::ostream::_M_insert<double>((double)section.m_log);
    std::operator<<((ostream *)poVar1,"us, Standard deviation: ");
    std::ostream::_M_insert<double>(local_238);
    std::operator<<((ostream *)poVar1,"us, Standard error of mean: ");
    local_280 = (double)local_230[0]._0_8_;
    std::ostream::_M_insert<double>((double)local_230[0]._0_8_);
    std::operator<<((ostream *)poVar1,"us(");
    local_280 = local_280 / (double)local_288;
    std::ostream::_M_insert<double>(local_280);
    std::operator<<((ostream *)poVar1,")");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Unbatched samples; Count: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,", Mean: ");
    local_278 = unbatchedStats.mean;
    std::ostream::_M_insert<double>(unbatchedStats.mean);
    std::operator<<((ostream *)poVar1,"us, Standard deviation: ");
    std::ostream::_M_insert<double>(unbatchedStats.standardDeviation);
    std::operator<<((ostream *)poVar1,"us, Standard error of mean: ");
    local_270 = unbatchedStats.standardErrorOfMean;
    std::ostream::_M_insert<double>(unbatchedStats.standardErrorOfMean);
    std::operator<<((ostream *)poVar1,"us(");
    local_270 = local_270 / local_278;
    std::ostream::_M_insert<double>(local_270);
    std::operator<<((ostream *)poVar1,")");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    if (*piVar2 < 3) {
      if (local_280 + local_270 <= 0.05 && 0 < *piVar2) goto LAB_00403388;
      if (0.02 < local_270) {
        poVar1 = &local_1b0.m_str;
        local_1b0.m_log = pTVar4;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"Unbatched standard error of mean outside of range.");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      if (0.02 < local_280) {
        poVar1 = &local_1b0.m_str;
        local_1b0.m_log = pTVar4;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"Batched standard error of mean outside of range.");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      if (unbatchedStats.standardDeviation <= 0.0) {
        puVar7 = (this->m_unbatchedSamplesUs).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar8 = (this->m_unbatchedSamplesUs).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar9 = (int)((ulong)((long)puVar8 - (long)puVar7) >> 3);
      }
      else {
        dVar17 = (unbatchedStats.standardDeviation / local_278) / 0.02;
        puVar7 = (this->m_unbatchedSamplesUs).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar8 = (this->m_unbatchedSamplesUs).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar9 = (int)(dVar17 * dVar17);
        iVar12 = (int)((ulong)((long)puVar8 - (long)puVar7) >> 3);
        if (iVar9 < iVar12) {
          iVar9 = iVar12;
        }
      }
      this->m_unbatchedSampleCount = iVar9;
      if (local_238 <= 0.0) {
        puVar10 = (this->m_batchedSamplesUs).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar15 = (this->m_batchedSamplesUs).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        iVar9 = (int)((ulong)((long)puVar15 - (long)puVar10) >> 3);
      }
      else {
        dVar17 = (local_238 / (double)local_288) / 0.02;
        puVar10 = (this->m_batchedSamplesUs).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar15 = (this->m_batchedSamplesUs).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        iVar9 = (int)(dVar17 * dVar17);
        iVar12 = (int)((ulong)((long)puVar15 - (long)puVar10) >> 3);
        if (iVar9 < iVar12) {
          iVar9 = iVar12;
        }
      }
      this->m_batchedSampleCount = iVar9;
      if (puVar15 != puVar10) {
        (this->m_batchedSamplesUs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar10;
      }
      if (puVar8 != puVar7) {
        (this->m_unbatchedSamplesUs).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar7;
      }
      this->m_sampleIteration = this->m_sampleIteration + 1;
      this->m_state = STATE_SAMPLE;
    }
    else {
      poVar1 = &local_1b0.m_str;
      local_1b0.m_log = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Maximum iteration count reached.");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
LAB_00403388:
      poVar1 = &local_1b0.m_str;
      local_1b0.m_log = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Standard errors in target range.");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      poVar1 = &local_1b0.m_str;
      local_1b0.m_log = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Batched/Unbatched ratio: ");
      local_288 = (TestLog *)((double)local_288 / local_278);
      std::ostream::_M_insert<double>((double)local_288);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
      de::floatToString_abi_cxx11_
                ((string *)&local_1b0,(de *)0x1,(float)(double)local_288,precision);
      IVar11 = STOP;
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_1b0.m_log);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&section_1);
    break;
  case STATE_SAMPLE:
    uVar14 = (long)(this->m_unbatchedSamplesUs).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_unbatchedSamplesUs).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if ((int)uVar14 < this->m_unbatchedSampleCount) {
      uVar6 = (long)(this->m_batchedSamplesUs).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_batchedSamplesUs).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
      uVar16 = (long)uVar6 >> 3;
      iVar9 = this->m_batchedSampleCount;
      if (((int)uVar16 < iVar9) &&
         (auVar18._0_8_ =
               ((double)(uVar14 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar14 & 0xffffffff | 0x4330000000000000),
         auVar18._8_8_ =
              ((double)(uVar16 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
              (double)(uVar16 & 0xffffffff | 0x4330000000000000),
         auVar19._0_8_ = (double)this->m_unbatchedSampleCount, auVar19._8_8_ = (double)iVar9,
         auVar19 = divpd(auVar18,auVar19), auVar19._8_8_ <= auVar19._0_8_)) goto LAB_00403241;
      this_01 = &this->m_unbatchedSamplesUs;
      local_1b0.m_log = (TestLog *)renderUnbatched(this);
    }
    else {
      iVar9 = this->m_batchedSampleCount;
      uVar6 = (long)(this->m_batchedSamplesUs).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_batchedSamplesUs).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
LAB_00403241:
      if (iVar9 <= (int)(uVar6 >> 3)) {
        this->m_state = STATE_CALC_CALIBRATION;
        return CONTINUE;
      }
      this_01 = &this->m_batchedSamplesUs;
      local_1b0.m_log = (TestLog *)renderBatched(this);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (this_01,(unsigned_long *)&local_1b0);
  }
  return IVar11;
}

Assistant:

tcu::TestCase::IterateResult DrawCallBatchingTest::iterate (void)
{
	if (m_state == STATE_LOG_INFO)
	{
		logTestInfo();
		m_state = STATE_WARMUP_BATCHED;
	}
	else if (m_state == STATE_WARMUP_BATCHED)
	{
		renderBatched();
		m_state = STATE_WARMUP_UNBATCHED;
	}
	else if (m_state == STATE_WARMUP_UNBATCHED)
	{
		renderUnbatched();
		m_state = STATE_SAMPLE;
	}
	else if (m_state == STATE_SAMPLE)
	{
		if ((int)m_unbatchedSamplesUs.size() < m_unbatchedSampleCount && ((double)m_unbatchedSamplesUs.size() / ((double)m_unbatchedSampleCount) < (double)m_batchedSamplesUs.size() / ((double)m_batchedSampleCount) || (int)m_batchedSamplesUs.size() >= m_batchedSampleCount))
			m_unbatchedSamplesUs.push_back(renderUnbatched());
		else if ((int)m_batchedSamplesUs.size() < m_batchedSampleCount)
			m_batchedSamplesUs.push_back(renderBatched());
		else
			m_state = STATE_CALC_CALIBRATION;
	}
	else if (m_state == STATE_CALC_CALIBRATION)
	{
		TestLog& log = m_testCtx.getLog();

		tcu::ScopedLogSection	section(log, ("Sampling iteration " + de::toString(m_sampleIteration)).c_str(), ("Sampling iteration " + de::toString(m_sampleIteration)).c_str());
		const double targetSEM	= 0.02;
		const double limitSEM	= 0.025;

		Statistics unbatchedStats	= calculateStats(m_unbatchedSamplesUs);
		Statistics batchedStats		= calculateStats(m_batchedSamplesUs);

		log << TestLog::Message << "Batched samples; Count: " << m_batchedSamplesUs.size() << ", Mean: " << batchedStats.mean << "us, Standard deviation: " << batchedStats.standardDeviation << "us, Standard error of mean: " << batchedStats.standardErrorOfMean << "us(" << (batchedStats.standardErrorOfMean/batchedStats.mean) << ")" << TestLog::EndMessage;
		log << TestLog::Message << "Unbatched samples; Count: " << m_unbatchedSamplesUs.size() << ", Mean: " << unbatchedStats.mean << "us, Standard deviation: " << unbatchedStats.standardDeviation << "us, Standard error of mean: " << unbatchedStats.standardErrorOfMean << "us(" << (unbatchedStats.standardErrorOfMean/unbatchedStats.mean) << ")" << TestLog::EndMessage;

		if (m_sampleIteration > 2 || (m_sampleIteration > 0 && (unbatchedStats.standardErrorOfMean/unbatchedStats.mean) + (batchedStats.standardErrorOfMean/batchedStats.mean) <= 2.0 * limitSEM))
		{
			if (m_sampleIteration > 2)
				log << TestLog::Message << "Maximum iteration count reached." << TestLog::EndMessage;

			log << TestLog::Message << "Standard errors in target range." << TestLog::EndMessage;
			log << TestLog::Message << "Batched/Unbatched ratio: " << (batchedStats.mean / unbatchedStats.mean) << TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)(batchedStats.mean/unbatchedStats.mean), 1).c_str());
			return STOP;
		}
		else
		{
			if ((unbatchedStats.standardErrorOfMean/unbatchedStats.mean) > targetSEM)
				log << TestLog::Message << "Unbatched standard error of mean outside of range." << TestLog::EndMessage;

			if ((batchedStats.standardErrorOfMean/batchedStats.mean) > targetSEM)
				log << TestLog::Message << "Batched standard error of mean outside of range." << TestLog::EndMessage;

			if (unbatchedStats.standardDeviation > 0.0)
			{
				double x = (unbatchedStats.standardDeviation / unbatchedStats.mean) / targetSEM;
				m_unbatchedSampleCount = std::max((int)m_unbatchedSamplesUs.size(), (int)(x * x));
			}
			else
				m_unbatchedSampleCount = (int)m_unbatchedSamplesUs.size();

			if (batchedStats.standardDeviation > 0.0)
			{
				double x = (batchedStats.standardDeviation / batchedStats.mean) / targetSEM;
				m_batchedSampleCount = std::max((int)m_batchedSamplesUs.size(), (int)(x * x));
			}
			else
				m_batchedSampleCount = (int)m_batchedSamplesUs.size();

			m_batchedSamplesUs.clear();
			m_unbatchedSamplesUs.clear();

			m_sampleIteration++;
			m_state = STATE_SAMPLE;
		}
	}
	else
		DE_ASSERT(false);

	return CONTINUE;
}